

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Real __thiscall NavierStokesBase::predict_velocity(NavierStokesBase *this,Real dt)

{
  Geometry *a_geom;
  BoxArray *bxs;
  DistributionMapping *dm;
  pointer ppMVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  FArrayBox *pFVar2;
  MultiFab *pMVar3;
  MultiFab *a_umac;
  BCRec *d_bcrec;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  FillPatchIterator *pFVar7;
  int *piVar8;
  Print *pPVar9;
  long lVar10;
  int j;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  NavierStokesBase *pNVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int k;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  Real time;
  Real time_00;
  double dVar29;
  double __x;
  double dVar30;
  double dVar31;
  initializer_list<const_amrex::MultiFab_*> __l;
  ulong in_stack_fffffffffffff4e0;
  Box gbx;
  Vector<double,_std::allocator<double>_> umax;
  Array4<const_double> local_9f8;
  Array4<const_double> local_9b8;
  MFIter U_mfi;
  Array4<const_double> local_918;
  undefined1 local_8d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_8c8;
  int local_8b0;
  FillPatchIterator U_fpi;
  FillPatchIterator S_fpi;
  MultiFab forcing_term;
  MultiFab visc_terms;
  
  if (verbose != 0) {
    poVar6 = amrex::OutStream();
    amrex::Print::Print((Print *)&U_fpi,poVar6);
    std::operator<<((ostream *)&U_fpi.super_MFIter.tile_size,"... predict edge velocities\n");
    amrex::Print::~Print((Print *)&U_fpi);
  }
  time = amrex::StateData::prevTime
                   ((this->super_AmrLevel).state.
                    super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                    super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                    super__Vector_impl_data._M_start);
  pNVar15 = (NavierStokesBase *)
            ((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  time_00 = amrex::StateData::prevTime((StateData *)pNVar15);
  dVar29 = amrex::ParallelDescriptor::second();
  bxs = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  iVar5 = nghost_force(pNVar15);
  U_fpi.super_MFIter.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  U_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
  U_fpi.super_MFIter.tile_size.vect[0] = 0;
  U_fpi.super_MFIter.tile_size.vect[1] = 0;
  U_fpi.super_MFIter.tile_size.vect[2] = 0;
  U_fpi.super_MFIter.flags = '\0';
  U_fpi.super_MFIter._29_3_ = 0;
  U_fpi.super_MFIter.currentIndex = 0;
  U_fpi.super_MFIter.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&visc_terms,bxs,dm,3,iVar5,(MFInfo *)&U_fpi,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&U_fpi.super_MFIter.tile_size);
  iVar5 = nghost_state(this);
  pNVar15 = (NavierStokesBase *)&U_fpi;
  amrex::FillPatchIterator::FillPatchIterator
            ((FillPatchIterator *)pNVar15,&this->super_AmrLevel,&visc_terms,iVar5,time,0,0,3);
  floor(pNVar15,__x);
  __l._M_len = 1;
  __l._M_array = (iterator)local_8d8;
  local_8d8._0_8_ = &U_fpi.m_fabs;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&S_fpi,__l
             ,(allocator_type *)&forcing_term);
  amrex::VectorMaxAbs(&umax,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             *)&S_fpi,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,0,3,
                      U_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect
                      [0]);
  a_geom = &(this->super_AmrLevel).geom;
  std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
  ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                &S_fpi);
  dVar30 = (*umax.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start * dt) / (this->super_AmrLevel).geom.super_CoordSys.dx[0];
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    dVar31 = (umax.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10 + 1] * dt) / (this->super_AmrLevel).geom.super_CoordSys.dx[lVar10 + 1]
    ;
    if (dVar31 <= dVar30) {
      dVar31 = dVar30;
    }
    dVar30 = dVar31;
  }
  if ((dVar30 != 0.0) || (NAN(dVar30))) {
    S_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )(cfl / dVar30);
    pFVar7 = (FillPatchIterator *)&change_max;
    if (cfl / dVar30 < change_max) {
      pFVar7 = &S_fpi;
    }
  }
  else {
    pFVar7 = (FillPatchIterator *)&change_max;
  }
  pMVar3 = &U_fpi.m_fabs;
  ppMVar1 = ((_Vector_impl_data *)&(pFVar7->super_MFIter).m_fa)->_M_start;
  bVar4 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PLM");
  if (((bVar4) || (bVar4 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PPM"), bVar4)) ||
     (bVar4 = std::operator==(&advection_scheme_abi_cxx11_,"BDS"), bVar4)) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    if (0 < (this->super_AmrLevel).level) {
      amrex::AmrLevel::FillPatch
                (&this->super_AmrLevel,
                 (MultiFab *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                 ((IntVect *)
                 ((long)this_00.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
                 [0],time_00,2,0,3,0);
    }
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x33])(time,this,&visc_terms,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&visc_terms.super_FabArray<amrex::FArrayBox>,0.0);
    }
    iVar5 = nghost_state(this);
    pNVar15 = (NavierStokesBase *)&S_fpi;
    amrex::FillPatchIterator::FillPatchIterator
              ((FillPatchIterator *)pNVar15,&this->super_AmrLevel,&visc_terms,iVar5,time,0,3,
               NUM_SCALARS);
    iVar5 = nghost_force(pNVar15);
    local_8d8._0_8_ = (MultiFab *)0x1;
    local_8d8._8_8_ = (Arena *)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    U_mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )&PTR__FabFactory_006d8928;
    amrex::MultiFab::MultiFab
              (&forcing_term,bxs,dm,3,iVar5,(MFInfo *)local_8d8,
               (FabFactory<amrex::FArrayBox> *)&U_mfi);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_8c8);
    pNVar15 = (NavierStokesBase *)&U_mfi;
    amrex::MFIter::MFIter((MFIter *)pNVar15,(FabArrayBase *)pMVar3,true);
    while( true ) {
      if (U_mfi.endIndex <= U_mfi.currentIndex) break;
      iVar5 = U_mfi.currentIndex;
      if (U_mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar5 = ((U_mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[U_mfi.currentIndex];
      }
      pFVar2 = U_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5];
      iVar5 = nghost_force(pNVar15);
      amrex::MFIter::growntilebox(&gbx,&U_mfi,iVar5);
      if (getForceVerbose != 0) {
        poVar6 = amrex::OutStream();
        amrex::Print::Print((Print *)local_8d8,poVar6);
        std::operator<<((ostream *)&vStack_8c8,"---\nA - Predict velocity:\n Calling getForce...\n")
        ;
        amrex::Print::~Print((Print *)local_8d8);
      }
      piVar8 = &U_mfi.currentIndex;
      if (U_mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar8 = ((U_mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + U_mfi.currentIndex;
      }
      in_stack_fffffffffffff4e0 = in_stack_fffffffffffff4e0 & 0xffffffff00000000;
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
                (time,this,
                 forcing_term.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar8],&gbx,0,3,pFVar2,
                 S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar8],in_stack_fffffffffffff4e0,&U_mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_8d8,&forcing_term.super_FabArray<amrex::FArrayBox>,&U_mfi,0
                );
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_9b8,&visc_terms.super_FabArray<amrex::FArrayBox>,&U_mfi,0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_9f8,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&U_mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_918,&S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,&U_mfi);
      lVar10 = (long)gbx.smallend.vect[1];
      lVar18 = (long)gbx.smallend.vect[2];
      lVar19 = (long)gbx.smallend.vect[0];
      lVar20 = (lVar10 - local_9f8.begin.y) * local_9f8.jstride * 8 +
               (lVar18 - local_9f8.begin.z) * local_9f8.kstride * 8 + lVar19 * 8 +
               (long)local_9f8.begin.x * -8 + (long)local_9f8.p;
      lVar27 = (lVar10 - local_9b8.begin.y) * local_9b8.jstride * 8 +
               (lVar18 - local_9b8.begin.z) * local_9b8.kstride * 8 + lVar19 * 8 +
               (long)local_9b8.begin.x * -8 + (long)local_9b8.p;
      lVar24 = (lVar10 - vStack_8c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
               local_8d8._8_8_ * 8 +
               (lVar18 - local_8b0) *
               (long)vStack_8c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start * 8 + lVar19 * 8 +
               (long)(int)vStack_8c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 + local_8d8._0_8_;
      for (lVar14 = 0; lVar12 = lVar27, lVar16 = lVar20,
          lVar21 = (lVar10 - local_918.begin.y) * local_918.jstride * 8 +
                   (lVar18 - local_918.begin.z) * local_918.kstride * 8 + lVar19 * 8 +
                   (long)local_918.begin.x * -8 + (long)local_918.p, lVar23 = lVar18,
          lVar25 = lVar24, lVar14 != 3; lVar14 = lVar14 + 1) {
        for (; lVar11 = lVar10, lVar13 = lVar12, lVar17 = lVar16, lVar22 = lVar21, lVar26 = lVar25,
            lVar23 <= gbx.bigend.vect[2]; lVar23 = lVar23 + 1) {
          for (; lVar11 <= gbx.bigend.vect[1]; lVar11 = lVar11 + 1) {
            if (gbx.smallend.vect[0] <= gbx.bigend.vect[0]) {
              lVar28 = 0;
              do {
                *(double *)(lVar26 + lVar28 * 8) =
                     ((*(double *)(lVar26 + lVar28 * 8) + *(double *)(lVar13 + lVar28 * 8)) -
                     *(double *)(lVar17 + lVar28 * 8)) / *(double *)(lVar22 + lVar28 * 8);
                lVar28 = lVar28 + 1;
              } while ((gbx.bigend.vect[0] - gbx.smallend.vect[0]) + 1 != (int)lVar28);
            }
            lVar22 = lVar22 + local_918.jstride * 8;
            lVar17 = lVar17 + local_9f8.jstride * 8;
            lVar13 = lVar13 + local_9b8.jstride * 8;
            lVar26 = lVar26 + local_8d8._8_8_ * 8;
          }
          lVar12 = lVar12 + local_9b8.kstride * 8;
          lVar16 = lVar16 + local_9f8.kstride * 8;
          lVar21 = lVar21 + local_918.kstride * 8;
          lVar25 = lVar25 + (long)vStack_8c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 8;
        }
        lVar20 = lVar20 + local_9f8.nstride * 8;
        lVar27 = lVar27 + local_9b8.nstride * 8;
        lVar24 = lVar24 + (long)vStack_8c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish * 8;
      }
      pNVar15 = (NavierStokesBase *)&U_mfi;
      amrex::MFIter::operator++((MFIter *)pNVar15);
    }
    amrex::MFIter::~MFIter(&U_mfi);
    bVar4 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    if (bVar4) {
      bVar4 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PPM");
      pMVar3 = this->u_mac;
      Godunov::ExtrapVelToFaces
                (&U_fpi.m_fabs,&forcing_term,pMVar3,pMVar3 + 1,pMVar3 + 2,&this->m_bcrec_velocity,
                 (this->m_bcrec_velocity_d).m_data,a_geom,dt,bVar4,godunov_use_forces_in_trans);
    }
    else {
      pMVar3 = this->u_mac;
      EBGodunov::ExtrapVelToFaces
                (&U_fpi.m_fabs,&forcing_term,pMVar3,pMVar3 + 1,pMVar3 + 2,&this->m_bcrec_velocity,
                 (this->m_bcrec_velocity_d).m_data,a_geom,dt);
    }
    amrex::MultiFab::~MultiFab(&forcing_term);
    amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  }
  else {
    bVar4 = std::operator==(&advection_scheme_abi_cxx11_,"MOL");
    if (bVar4) {
      bVar4 = amrex::EBFArrayBoxFactory::isAllRegular
                        ((EBFArrayBoxFactory *)
                         (this->super_AmrLevel).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      a_umac = this->u_mac;
      d_bcrec = (this->m_bcrec_velocity_d).m_data;
      if (bVar4) {
        MOL::ExtrapVelToFaces
                  (pMVar3,a_umac,a_umac + 1,a_umac + 2,a_geom,&this->m_bcrec_velocity,d_bcrec);
      }
      else {
        EBMOL::ExtrapVelToFaces
                  (pMVar3,a_umac,a_umac + 1,a_umac + 2,a_geom,&this->m_bcrec_velocity,d_bcrec);
      }
    }
    else {
      amrex::Abort_host("NSB::predict_velocity: Unkown advection_scheme");
    }
  }
  if (1 < verbose) {
    dVar30 = amrex::ParallelDescriptor::second();
    poVar6 = amrex::OutStream();
    amrex::Print::Print((Print *)&S_fpi,poVar6);
    std::operator<<((ostream *)&S_fpi.super_MFIter.tile_size,
                    "NavierStokesBase::predict_velocity(): lev: ");
    pPVar9 = amrex::Print::operator<<((Print *)&S_fpi,&(this->super_AmrLevel).level);
    std::operator<<((ostream *)&pPVar9->ss,", time: ");
    std::ostream::_M_insert<double>(dVar30 - dVar29);
    std::operator<<((ostream *)&pPVar9->ss,'\n');
    amrex::Print::~Print((Print *)&S_fpi);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&umax);
  amrex::FillPatchIterator::~FillPatchIterator(&U_fpi);
  amrex::MultiFab::~MultiFab(&visc_terms);
  return (double)ppMVar1 * dt;
}

Assistant:

Real
NavierStokesBase::predict_velocity (Real  dt)
{
   BL_PROFILE("NavierStokesBase::predict_velocity()");
   if (verbose) {
      amrex::Print() << "... predict edge velocities\n";
   }
   //
   // Get simulation parameters.
   //
   const int   nComp          = AMREX_SPACEDIM;
   const Real* dx             = geom.CellSize();
   const Real  prev_time      = state[State_Type].prevTime();
   const Real  prev_pres_time = state[Press_Type].prevTime();
   const Real  strt_time      = ParallelDescriptor::second();

   //
   // Compute viscous terms at level n.
   // Ensure reasonable values in 1 grow cell.  Here, do extrap for
   // c-f/phys boundary, since we have no interpolator fn, also,
   // preserve extrap for corners at periodic/non-periodic intersections.
   //
   MultiFab visc_terms(grids,dmap,nComp,nghost_force(),MFInfo(), Factory());

   FillPatchIterator U_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
   MultiFab& Umf=U_fpi.get_mf();

   // Floor small values of states to be extrapolated
   floor(Umf);

   //
   // Compute "grid cfl number" based on cell-centered time-n velocities
   //
   auto umax = VectorMaxAbs({&Umf},FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,Umf.nGrow());
   Real cflmax = dt*umax[0]/dx[0];
   for (int d=1; d<AMREX_SPACEDIM; ++d) {
     cflmax = std::max(cflmax,dt*umax[d]/dx[d]);
   }
   Real tempdt = cflmax==0 ? change_max : std::min(change_max,cfl/cflmax);

   if ( advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || advection_scheme == "BDS")
   {
       MultiFab& Gp = get_old_data(Gradp_Type);
       // FillPatch Gp here, as crse data has been updated
       // only really needed on the first step of the fine subcycle
       // because level_project at this level fills Gp ghost cells.
       // OR maybe better to not FP in level_proj for level>0 and do it
       // once the first time it's needed, which is presumably here...
       if ( level > 0 )
           FillPatch(*this,Gp,Gp.nGrow(),prev_pres_time,Gradp_Type,0,AMREX_SPACEDIM);

       if (be_cn_theta != 1.0)
       {
           getViscTerms(visc_terms,Xvel,nComp,prev_time);
       }
       else
       {
           visc_terms.setVal(0.0);
       }

       FillPatchIterator S_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Density,NUM_SCALARS);
       MultiFab& Smf=S_fpi.get_mf();

       MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force() );

       //
       // Compute forcing
       //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       {
           for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
           {
               FArrayBox& Ufab = Umf[U_mfi];
               auto const  gbx = U_mfi.growntilebox(nghost_force());

               if (getForceVerbose) {
                   Print() << "---\nA - Predict velocity:\n Calling getForce...\n";
               }

               getForce(forcing_term[U_mfi],gbx,Xvel,AMREX_SPACEDIM,prev_time,Ufab,Smf[U_mfi],0,U_mfi);

               //
               // Compute the total forcing.
               //
               auto const& tf   = forcing_term.array(U_mfi,Xvel);
               auto const& visc = visc_terms.const_array(U_mfi,Xvel);
               auto const& gp   = Gp.const_array(U_mfi);
               auto const& rho  = Smf.const_array(U_mfi);

               amrex::ParallelFor(gbx, AMREX_SPACEDIM, [tf, visc, gp, rho]
               AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
               {
                   tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) ) / rho(i,j,k);
               });
           }
       }

#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
           EBGodunov::ExtrapVelToFaces( Umf, forcing_term,
                                        AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                        m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                        geom, dt );
       }
       else
#endif
       {
           bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

           Godunov::ExtrapVelToFaces( Umf, forcing_term,
                                      AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                      m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                      geom, dt,
                                      godunov_use_ppm, godunov_use_forces_in_trans );
       }

   }
   else if ( advection_scheme == "MOL" )
   {
#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
            EBMOL::ExtrapVelToFaces( Umf,
                                     AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                     geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
       else
#endif
       {
            MOL::ExtrapVelToFaces( Umf,
                                   AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                   geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
   }
   else
   {
       Abort("NSB::predict_velocity: Unkown advection_scheme");
   }

   if (verbose > 1)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      Print() << "NavierStokesBase::predict_velocity(): lev: " << level
              << ", time: " << run_time << '\n';
   }

   return dt*tempdt;
}